

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_214010::CAPIBuildSystemFrontendDelegate::CAPIRulesVector::CAPIRulesVector
          (CAPIRulesVector *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items)

{
  pointer ppRVar1;
  pointer ppRVar2;
  CAPIBuildKey *this_00;
  allocator_type *in_RDX;
  long lVar3;
  BuildKey key;
  
  std::
  vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
  ::vector(&this->rules,
           (long)(items->
                 super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(items->
                 super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3,in_RDX);
  ppRVar2 = (items->
            super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  for (lVar3 = 0; ppRVar1 = (pointer)(lVar3 + (long)ppRVar2),
      ppRVar1 !=
      (items->super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>).
      _M_impl.super__Vector_impl_data._M_finish; lVar3 = lVar3 + 8) {
    llbuild::buildsystem::BuildKey::fromData(&key,&(*ppRVar1)->key);
    this_00 = (CAPIBuildKey *)operator_new(0x38);
    CAPIBuildKey::CAPIBuildKey(this_00,&key);
    *(CAPIBuildKey **)
     ((long)(this->rules).
            super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar3) = this_00;
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

CAPIRulesVector(const std::vector<core::Rule*>& items) : rules(items.size()) {
      int idx = 0;

      for (std::vector<core::Rule*>::const_iterator it = items.begin(); it != items.end(); ++it) {
        core::Rule* rule = *it;
        auto key = BuildKey::fromData(rule->key);
        rules[idx++] = new CAPIBuildKey(key);
      }
    }